

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

size_t __thiscall
Assimp::ColladaParser::ReadPrimitives
          (ColladaParser *this,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t pNumPrimitives,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount,PrimitiveType pPrimType)

{
  byte *pbVar1;
  pointer *ppuVar2;
  byte bVar3;
  size_t __n;
  iterator __position;
  undefined8 uVar4;
  int iVar5;
  InputChannel *channel;
  pointer pIVar6;
  byte *pbVar7;
  ulong uVar8;
  Accessor *pAVar9;
  Data *pDVar10;
  uint uVar11;
  uint uVar12;
  ulong numOffsets;
  size_t currentVertex;
  long lVar13;
  size_type __n_00;
  size_t sVar14;
  size_t perVertexOffset;
  ColladaParser *this_00;
  undefined4 in_register_0000008c;
  InputChannel *input;
  pointer pIVar15;
  size_t currentPrimitive;
  size_t numPoints;
  undefined8 local_98;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *local_90;
  undefined1 local_88 [48];
  string local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  
  local_88._32_8_ = CONCAT44(in_register_0000008c,pPrimType);
  pIVar6 = (pPerIndexChannels->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar15 = (pPerIndexChannels->
            super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar6 == pIVar15) {
    perVertexOffset = 0xffffffffffffffff;
    numOffsets = 1;
  }
  else {
    numOffsets = 1;
    perVertexOffset = 0xffffffffffffffff;
    do {
      uVar8 = pIVar6->mOffset + 1;
      if (uVar8 < numOffsets) {
        uVar8 = numOffsets;
      }
      numOffsets = uVar8;
      if (pIVar6->mType == IT_Vertex) {
        perVertexOffset = pIVar6->mOffset;
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar15);
  }
  local_90 = pPerIndexChannels;
  __range2 = pVCount;
  if (pPrimType == Prim_Lines) {
    lVar13 = pNumPrimitives * 2;
LAB_003f9ad6:
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (unsigned_long *)0x0;
    local_88._16_8_ = (unsigned_long *)0x0;
    if (lVar13 == 0) goto LAB_003f9b0c;
    this_00 = (ColladaParser *)local_88;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,lVar13 * numOffsets)
    ;
    local_98 = (DataLibrary *)((ulong)local_98._4_4_ << 0x20);
    local_88._24_8_ = lVar13;
  }
  else {
    if (pPrimType == Prim_Triangles) {
      lVar13 = pNumPrimitives * 3;
      goto LAB_003f9ad6;
    }
    if (pPrimType == Prim_Polylist) {
      pIVar6 = (pointer)(pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
      pIVar15 = (pointer)(pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar6 != pIVar15) {
        lVar13 = 0;
        do {
          lVar13 = lVar13 + *(long *)pIVar6;
          pIVar6 = (pointer)&pIVar6->mIndex;
        } while (pIVar6 != pIVar15);
        goto LAB_003f9ad6;
      }
    }
LAB_003f9b0c:
    local_88._16_8_ = (unsigned_long *)0x0;
    local_88._8_8_ = (unsigned_long *)0x0;
    local_88._0_8_ = (pointer)0x0;
    local_98 = (DataLibrary *)CONCAT44(local_98._4_4_,(int)CONCAT71((int7)((ulong)pIVar6 >> 8),1));
    local_88._24_8_ = 0;
    this_00 = this;
  }
  local_88._40_8_ = pNumPrimitives;
  if (pNumPrimitives != 0) {
    this_00 = this;
    pbVar7 = (byte *)GetTextContent(this);
    uVar8 = (ulong)*pbVar7;
    if (*pbVar7 != 0) {
      do {
        pbVar7 = pbVar7 + (((char)uVar8 - 0x2bU & 0xfd) == 0);
        this_00 = (ColladaParser *)0x0;
        bVar3 = *pbVar7;
        while (uVar12 = (uint)this_00, 0xf5 < (byte)(bVar3 - 0x3a)) {
          this_00 = (ColladaParser *)(ulong)((uint)(byte)(bVar3 - 0x30) + uVar12 * 10);
          pbVar1 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
          bVar3 = *pbVar1;
        }
        uVar11 = -uVar12;
        if ((char)uVar8 != '-') {
          uVar11 = uVar12;
        }
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        local_58._M_dataplus._M_p = (pointer)(ulong)uVar11;
        if (local_88._8_8_ == local_88._16_8_) {
          this_00 = (ColladaParser *)local_88;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                     (iterator)local_88._8_8_,(unsigned_long *)&local_58);
        }
        else {
          *(pointer *)local_88._8_8_ = local_58._M_dataplus._M_p;
          local_88._8_8_ = local_88._8_8_ + 8;
        }
        for (; uVar8 = (ulong)*pbVar7, uVar8 < 0x21; pbVar7 = pbVar7 + 1) {
          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
            if (uVar8 == 0) goto LAB_003f9be8;
            break;
          }
        }
      } while( true );
    }
  }
LAB_003f9be8:
  uVar8 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
  if ((char)local_98 == '\0') {
    if (uVar8 != local_88._24_8_ * numOffsets) {
      if (local_88._32_4_ != 1) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Expected different index count in <p> element.","");
        ThrowException(this,&local_58);
      }
      ReportWarning(this_00,"Expected different index count in <p> element, %zu instead of %zu.",
                    uVar8);
      local_88._40_8_ = (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets >> 1;
    }
  }
  else if (uVar8 % numOffsets != 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Expected different index count in <p> element.","");
    ThrowException(this,&local_58);
  }
  pIVar15 = (pMesh->mPerVertexData).
            super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar15 !=
      (pMesh->mPerVertexData).
      super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &this->mDataLibrary;
    do {
      if (pIVar15->mResolved == (Accessor *)0x0) {
        pAVar9 = ResolveLibraryReference<Assimp::Collada::Accessor>
                           (this,&this->mAccessorLibrary,&pIVar15->mAccessor);
        pIVar15->mResolved = pAVar9;
        if (pAVar9->mData == (Data *)0x0) {
          pDVar10 = ResolveLibraryReference<Assimp::Collada::Data>(this,local_98,&pAVar9->mSource);
          pAVar9->mData = pDVar10;
        }
      }
      pIVar15 = pIVar15 + 1;
    } while (pIVar15 !=
             (pMesh->mPerVertexData).
             super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar15 = (local_90->
            super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar15 !=
      (local_90->
      super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &this->mDataLibrary;
    do {
      if (pIVar15->mResolved == (Accessor *)0x0) {
        if (pIVar15->mType == IT_Vertex) {
          __n = (pIVar15->mAccessor)._M_string_length;
          if ((__n != (pMesh->mVertexID)._M_string_length) ||
             ((__n != 0 &&
              (iVar5 = bcmp((pIVar15->mAccessor)._M_dataplus._M_p,
                            (pMesh->mVertexID)._M_dataplus._M_p,__n), iVar5 != 0)))) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Unsupported vertex referencing scheme.","");
            ThrowException(this,&local_58);
          }
        }
        else {
          pAVar9 = ResolveLibraryReference<Assimp::Collada::Accessor>
                             (this,&this->mAccessorLibrary,&pIVar15->mAccessor);
          pIVar15->mResolved = pAVar9;
          if (pAVar9->mData == (Data *)0x0) {
            pDVar10 = ResolveLibraryReference<Assimp::Collada::Data>(this,local_98,&pAVar9->mSource)
            ;
            pAVar9->mData = pDVar10;
          }
        }
      }
      pIVar15 = pIVar15 + 1;
    } while (pIVar15 !=
             (local_90->
             super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  uVar12 = (uint)local_88._32_8_;
  __n_00 = local_88._40_8_;
  if ((uVar12 & 0xfffffffd) == 5) {
    __n_00 = 1;
  }
  if (uVar12 == 2) {
    lVar13 = -1;
  }
  else {
    lVar13 = -2;
    if (uVar12 != 4) goto LAB_003f9dd9;
  }
  __n_00 = (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets + lVar13;
LAB_003f9dd9:
  local_88._24_8_ = &pMesh->mFaceSize;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88._24_8_,__n_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&pMesh->mFacePosIndices,
             (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets);
  local_88._40_8_ = __n_00;
  if (__n_00 != 0) {
    currentPrimitive = 0;
    local_88._32_8_ = ZEXT48((int)local_88._32_8_ - 1);
    local_98 = (DataLibrary *)0x0;
    do {
      numPoints = 0;
      if (6 < (uint)local_88._32_8_) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Unsupported primitive type.","");
        ThrowException(this,&local_58);
      }
      switch((long)&switchD_003f9e5f::switchdataD_0075bb60 +
             (long)(int)(&switchD_003f9e5f::switchdataD_0075bb60)[local_88._32_8_]) {
      case 0x3f9e61:
        uVar8 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
        numPoints = uVar8 / numOffsets;
        if (numOffsets <= uVar8) {
          sVar14 = 0;
          do {
            CopyVertex(this,sVar14,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                       currentPrimitive,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
            sVar14 = sVar14 + 1;
          } while (sVar14 < numPoints);
        }
        break;
      case 0x3f9ec2:
        numPoints = 3;
        sVar14 = 0;
        do {
          CopyVertex(this,sVar14,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                     currentPrimitive,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar14 = sVar14 + 1;
        } while (sVar14 < numPoints);
        break;
      case 0x3f9f0a:
        numPoints = 3;
        ReadPrimTriStrips(this,numOffsets,perVertexOffset,pMesh,local_90,currentPrimitive,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
        break;
      case 0x3f9f3d:
        numPoints = 2;
        sVar14 = 0;
        do {
          CopyVertex(this,sVar14,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                     currentPrimitive,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar14 = sVar14 + 1;
        } while (sVar14 < numPoints);
        break;
      case 0x3f9f85:
        numPoints = 2;
        sVar14 = 0;
        do {
          CopyVertex(this,sVar14,numOffsets,1,perVertexOffset,pMesh,local_90,currentPrimitive,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar14 = sVar14 + 1;
        } while (sVar14 < numPoints);
        break;
      case 0x3f9fc7:
        numPoints = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[currentPrimitive];
        if (numPoints == 0) {
          sVar14 = 0;
        }
        else {
          uVar8 = 0;
          do {
            CopyVertex(this,(size_t)(&(local_98->_M_t)._M_impl.field_0x0 + uVar8),numOffsets,1,
                       perVertexOffset,pMesh,local_90,0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
            uVar8 = uVar8 + 1;
            sVar14 = numPoints;
          } while (uVar8 < numPoints);
        }
        local_98 = (DataLibrary *)(&(local_98->_M_t)._M_impl.field_0x0 + sVar14);
      }
      __position._M_current =
           (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_88._24_8_,__position
                   ,&numPoints);
      }
      else {
        *__position._M_current = numPoints;
        ppuVar2 = &(pMesh->mFaceSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      currentPrimitive = currentPrimitive + 1;
    } while (currentPrimitive != local_88._40_8_);
  }
  TestClosing(this,"p");
  uVar4 = local_88._40_8_;
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  return uVar4;
}

Assistant:

size_t ColladaParser::ReadPrimitives(Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels,
    size_t pNumPrimitives, const std::vector<size_t>& pVCount, PrimitiveType pPrimType)
{
    // determine number of indices coming per vertex
    // find the offset index for all per-vertex channels
    size_t numOffsets = 1;
    size_t perVertexOffset = SIZE_MAX; // invalid value
    for (const InputChannel& channel : pPerIndexChannels)
    {
        numOffsets = std::max(numOffsets, channel.mOffset + 1);
        if (channel.mType == IT_Vertex)
            perVertexOffset = channel.mOffset;
    }

    // determine the expected number of indices
    size_t expectedPointCount = 0;
    switch (pPrimType)
    {
    case Prim_Polylist:
    {
        for (size_t i : pVCount)
            expectedPointCount += i;
        break;
    }
    case Prim_Lines:
        expectedPointCount = 2 * pNumPrimitives;
        break;
    case Prim_Triangles:
        expectedPointCount = 3 * pNumPrimitives;
        break;
    default:
        // other primitive types don't state the index count upfront... we need to guess
        break;
    }

    // and read all indices into a temporary array
    std::vector<size_t> indices;
    if (expectedPointCount > 0)
        indices.reserve(expectedPointCount * numOffsets);

    if (pNumPrimitives > 0) // It is possible to not contain any indices
    {
        const char* content = GetTextContent();
        while (*content != 0)
        {
            // read a value.
            // Hack: (thom) Some exporters put negative indices sometimes. We just try to carry on anyways.
            int value = std::max(0, strtol10(content, &content));
            indices.push_back(size_t(value));
            // skip whitespace after it
            SkipSpacesAndLineEnd(&content);
        }
    }

    // complain if the index count doesn't fit
    if (expectedPointCount > 0 && indices.size() != expectedPointCount * numOffsets) {
        if (pPrimType == Prim_Lines) {
            // HACK: We just fix this number since SketchUp 15.3.331 writes the wrong 'count' for 'lines'
            ReportWarning("Expected different index count in <p> element, %zu instead of %zu.", indices.size(), expectedPointCount * numOffsets);
            pNumPrimitives = (indices.size() / numOffsets) / 2;
        }
        else
            ThrowException("Expected different index count in <p> element.");

    }
    else if (expectedPointCount == 0 && (indices.size() % numOffsets) != 0)
        ThrowException("Expected different index count in <p> element.");

    // find the data for all sources
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }
    // and the same for the per-index channels
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // ignore vertex pointer, it doesn't refer to an accessor
        if (input.mType == IT_Vertex)
        {
            // warn if the vertex channel does not refer to the <vertices> element in the same mesh
            if (input.mAccessor != pMesh->mVertexID)
                ThrowException("Unsupported vertex referencing scheme.");
            continue;
        }

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }

    // For continued primitives, the given count does not come all in one <p>, but only one primitive per <p>
    size_t numPrimitives = pNumPrimitives;
    if (pPrimType == Prim_TriFans || pPrimType == Prim_Polygon)
        numPrimitives = 1;
    // For continued primitives, the given count is actually the number of <p>'s inside the parent tag
    if (pPrimType == Prim_TriStrips) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 2;
    }
    if (pPrimType == Prim_LineStrip) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 1;
    }

    pMesh->mFaceSize.reserve(numPrimitives);
    pMesh->mFacePosIndices.reserve(indices.size() / numOffsets);

    size_t polylistStartVertex = 0;
    for (size_t currentPrimitive = 0; currentPrimitive < numPrimitives; currentPrimitive++)
    {
        // determine number of points for this primitive
        size_t numPoints = 0;
        switch (pPrimType)
        {
        case Prim_Lines:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_LineStrip:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Triangles:
            numPoints = 3;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_TriStrips:
            numPoints = 3;
            ReadPrimTriStrips(numOffsets, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Polylist:
            numPoints = pVCount[currentPrimitive];
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(polylistStartVertex + currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, 0, indices);
            polylistStartVertex += numPoints;
            break;
        case Prim_TriFans:
        case Prim_Polygon:
            numPoints = indices.size() / numOffsets;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        default:
            // LineStrip is not supported due to expected index unmangling
            ThrowException("Unsupported primitive type.");
            break;
        }

        // store the face size to later reconstruct the face from
        pMesh->mFaceSize.push_back(numPoints);
    }

    // if I ever get my hands on that guy who invented this steaming pile of indirection...
    TestClosing("p");
    return numPrimitives;
}